

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_min(lua_State *L)

{
  int iVar1;
  int narg;
  lua_Number n;
  lua_Number lVar2;
  
  iVar1 = lua_gettop(L);
  n = luaL_checknumber(L,1);
  for (narg = 2; narg <= iVar1; narg = narg + 1) {
    lVar2 = luaL_checknumber(L,narg);
    if (n <= lVar2) {
      lVar2 = n;
    }
    n = lVar2;
  }
  lua_pushnumber(L,n);
  return 1;
}

Assistant:

static int math_min (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  lua_Number dmin = luaL_checknumber(L, 1);
  int i;
  for (i=2; i<=n; i++) {
    lua_Number d = luaL_checknumber(L, i);
    if (d < dmin)
      dmin = d;
  }
  lua_pushnumber(L, dmin);
  return 1;
}